

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_math_min_max(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  JSValue val_00;
  int iVar1;
  int iVar2;
  int in_ECX;
  JSContext *in_RDI;
  int *in_R8;
  int in_R9D;
  JSValueUnion JVar3;
  JSValue JVar4;
  int r1;
  int a1;
  uint32_t tag;
  int i;
  double a;
  double r;
  BOOL is_max;
  anon_union_8_2_94730072 t;
  anon_union_8_2_94730072 u;
  int32_t val;
  JSValue v;
  double local_e0;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff34;
  int iVar5;
  JSValueUnion in_stack_ffffffffffffff38;
  JSValueUnion in_stack_ffffffffffffff40;
  JSValueUnion local_88;
  int64_t local_80;
  undefined4 uStack_64;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 uStack_44;
  JSValueUnion local_10;
  int64_t local_8;
  
  if (in_ECX == 0) {
    local_e0 = -INFINITY;
    if (in_R9D == 0) {
      local_e0 = INFINITY;
    }
    _local_88 = __JS_NewFloat64(in_RDI,local_e0);
  }
  else {
    iVar1 = (int)*(undefined8 *)(in_R8 + 2);
    if (iVar1 == 0) {
      in_stack_ffffffffffffff28 = *in_R8;
      for (iVar5 = 1; iVar5 < in_ECX; iVar5 = iVar5 + 1) {
        iVar1 = (int)*(undefined8 *)(in_R8 + (long)iVar5 * 4 + 2);
        if (iVar1 != 0) {
          in_stack_ffffffffffffff40.float64 = (double)in_stack_ffffffffffffff28;
          goto LAB_001bcd8e;
        }
        in_stack_ffffffffffffff2c = in_R8[(long)iVar5 * 4];
        if (in_R9D == 0) {
          in_stack_ffffffffffffff28 = min_int(in_stack_ffffffffffffff28,in_stack_ffffffffffffff2c);
        }
        else {
          in_stack_ffffffffffffff28 = max_int(in_stack_ffffffffffffff28,in_stack_ffffffffffffff2c);
        }
      }
      local_88._4_4_ = uStack_64;
      local_88.int32 = in_stack_ffffffffffffff28;
      local_80 = 0;
    }
    else {
      JVar4.tag = (int64_t)in_stack_ffffffffffffff40.ptr;
      JVar4.u.float64 = in_stack_ffffffffffffff38.float64;
      iVar5 = JS_ToFloat64((JSContext *)CONCAT44(in_stack_ffffffffffffff34,iVar1),
                           (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           JVar4);
      if (iVar5 == 0) {
        iVar5 = 1;
LAB_001bcd8e:
        while( true ) {
          if (in_ECX <= iVar5) {
            if (in_stack_ffffffffffffff40.ptr ==
                (void *)(double)(int)in_stack_ffffffffffffff40.float64) {
              local_10._4_4_ = uStack_44;
              local_10.int32 = (int)in_stack_ffffffffffffff40.float64;
              local_8 = 0;
            }
            else {
              JVar4 = __JS_NewFloat64(in_RDI,in_stack_ffffffffffffff40.float64);
              local_58 = JVar4.u;
              local_10 = local_58;
              local_50 = JVar4.tag;
              local_8 = local_50;
            }
            local_80 = local_8;
            local_88.float64 = local_10.float64;
            return _local_88;
          }
          val_00.tag = (int64_t)in_stack_ffffffffffffff40.ptr;
          val_00.u.float64 = in_stack_ffffffffffffff38.float64;
          iVar2 = JS_ToFloat64((JSContext *)CONCAT44(iVar5,iVar1),
                               (double *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),val_00)
          ;
          if (iVar2 != 0) break;
          JVar3 = in_stack_ffffffffffffff40;
          if ((!NAN(in_stack_ffffffffffffff40.float64)) &&
             (JVar3 = in_stack_ffffffffffffff38, !NAN(in_stack_ffffffffffffff38.float64))) {
            if (in_R9D == 0) {
              JVar3.float64 =
                   js_fmin(in_stack_ffffffffffffff40.float64,in_stack_ffffffffffffff38.float64);
            }
            else {
              JVar3.float64 =
                   js_fmax(in_stack_ffffffffffffff40.float64,in_stack_ffffffffffffff38.float64);
            }
          }
          iVar5 = iVar5 + 1;
          in_stack_ffffffffffffff40 = JVar3;
        }
        local_88.ptr = (void *)(local_88 << 0x20);
        local_80 = 6;
        return _local_88;
      }
      local_88.ptr = (void *)(local_88 << 0x20);
      local_80 = 6;
    }
  }
  return _local_88;
}

Assistant:

static JSValue js_math_min_max(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int magic)
{
    BOOL is_max = magic;
    double r, a;
    int i;
    uint32_t tag;

    if (unlikely(argc == 0)) {
        return __JS_NewFloat64(ctx, is_max ? -1.0 / 0.0 : 1.0 / 0.0);
    }

    tag = JS_VALUE_GET_TAG(argv[0]);
    if (tag == JS_TAG_INT) {
        int a1, r1 = JS_VALUE_GET_INT(argv[0]);
        for(i = 1; i < argc; i++) {
            tag = JS_VALUE_GET_TAG(argv[i]);
            if (tag != JS_TAG_INT) {
                r = r1;
                goto generic_case;
            }
            a1 = JS_VALUE_GET_INT(argv[i]);
            if (is_max)
                r1 = max_int(r1, a1);
            else
                r1 = min_int(r1, a1);

        }
        return JS_NewInt32(ctx, r1);
    } else {
        if (JS_ToFloat64(ctx, &r, argv[0]))
            return JS_EXCEPTION;
        i = 1;
    generic_case:
        while (i < argc) {
            if (JS_ToFloat64(ctx, &a, argv[i]))
                return JS_EXCEPTION;
            if (!isnan(r)) {
                if (isnan(a)) {
                    r = a;
                } else {
                    if (is_max)
                        r = js_fmax(r, a);
                    else
                        r = js_fmin(r, a);
                }
            }
            i++;
        }
        return JS_NewFloat64(ctx, r);
    }
}